

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_script.cpp
# Opt level: O3

int CfdGetTapBranchHandle
              (void *handle,void *tree_handle,uint8_t index_from_leaf,char **branch_hash,
              void **branch_tree_handle)

{
  Script *pSVar1;
  TaprootScriptTree *this;
  ulong uVar2;
  bool bVar3;
  char *pcVar4;
  void *pvVar5;
  vector<cfd::core::TaprootScriptTree,_std::allocator<cfd::core::TaprootScriptTree>_> *this_00;
  undefined8 *puVar6;
  CfdException *pCVar7;
  ulong uVar8;
  TapBranch *pTVar9;
  char *work_branch_hash;
  vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_> branches;
  TaprootScriptTree tree;
  ByteData256 hash_obj;
  vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_> local_f0;
  TaprootScriptTree local_d8;
  ByteData256 local_48;
  
  cfd::Initialize();
  pSVar1 = &local_d8.super_TapBranch.script_;
  local_d8.super_TapBranch._vptr_TapBranch = (_func_int **)pSVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"TapscriptTree","");
  cfd::capi::CheckBuffer(tree_handle,(string *)&local_d8);
  if ((Script *)local_d8.super_TapBranch._vptr_TapBranch != pSVar1) {
    operator_delete(local_d8.super_TapBranch._vptr_TapBranch);
  }
  if (branch_tree_handle == (void **)0x0) {
    local_d8.super_TapBranch._vptr_TapBranch = (_func_int **)0x5e1390;
    local_d8.super_TapBranch.has_leaf_ = true;
    local_d8.super_TapBranch.leaf_version_ = '\x03';
    local_d8.super_TapBranch._10_2_ = 0;
    local_d8.super_TapBranch.script_._vptr_Script = (_func_int **)0x5e18b6;
    cfd::core::logger::log<>
              ((CfdSourceLocation *)&local_d8,kCfdLogLevelWarning,
               "branch_tree_handle is null or empty.");
    pCVar7 = (CfdException *)__cxa_allocate_exception(0x30);
    local_d8.super_TapBranch._vptr_TapBranch = (_func_int **)pSVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_d8,"Failed to parameter. branch_tree_handle is null or empty.","");
    cfd::core::CfdException::CfdException(pCVar7,kCfdIllegalArgumentError,(string *)&local_d8);
    __cxa_throw(pCVar7,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  pTVar9 = (TapBranch *)**(long **)((long)tree_handle + 0x18);
  if ((pTVar9 == (TapBranch *)(*(long **)((long)tree_handle + 0x18))[1]) &&
     (pTVar9 = (TapBranch *)**(long **)((long)tree_handle + 0x10),
     (TapBranch *)(*(long **)((long)tree_handle + 0x10))[1] == pTVar9)) {
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
  }
  cfd::core::TapBranch::GetBranchList(&local_f0,pTVar9);
  uVar8 = ((long)local_f0.
                 super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)local_f0.
                 super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>.
                 _M_impl.super__Vector_impl_data._M_start >> 3) * -0x1111111111111111;
  uVar2 = (ulong)index_from_leaf;
  if ((uint)uVar8 <= (uint)index_from_leaf) {
    local_d8.super_TapBranch._vptr_TapBranch = (_func_int **)0x5e1390;
    local_d8.super_TapBranch.has_leaf_ = true;
    local_d8.super_TapBranch.leaf_version_ = '\x03';
    local_d8.super_TapBranch._10_2_ = 0;
    local_d8.super_TapBranch.script_._vptr_Script = (_func_int **)0x5e18b6;
    cfd::core::logger::log<>
              ((CfdSourceLocation *)&local_d8,kCfdLogLevelWarning,"index_from_leaf is out of range."
              );
    pCVar7 = (CfdException *)__cxa_allocate_exception(0x30);
    local_d8.super_TapBranch._vptr_TapBranch = (_func_int **)pSVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_d8,"Failed to parameter. index_from_leaf is out of range.","");
    cfd::core::CfdException::CfdException(pCVar7,kCfdOutOfRangeError,(string *)&local_d8);
    __cxa_throw(pCVar7,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (uVar2 <= uVar8 && uVar8 - uVar2 != 0) {
    pTVar9 = local_f0.
             super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>._M_impl
             .super__Vector_impl_data._M_start + uVar2;
    cfd::core::TapBranch::GetCurrentBranchHash(&local_48,pTVar9);
    if (branch_hash == (char **)0x0) {
      pcVar4 = (char *)0x0;
    }
    else {
      cfd::core::ByteData256::GetHex_abi_cxx11_((string *)&local_d8,&local_48);
      pcVar4 = cfd::capi::CreateString((string *)&local_d8);
      if ((Script *)local_d8.super_TapBranch._vptr_TapBranch != pSVar1) {
        operator_delete(local_d8.super_TapBranch._vptr_TapBranch);
      }
    }
    local_d8.super_TapBranch._vptr_TapBranch = (_func_int **)pSVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"TapscriptTree","");
    pvVar5 = cfd::capi::AllocBuffer((string *)&local_d8,0x20);
    if ((Script *)local_d8.super_TapBranch._vptr_TapBranch != pSVar1) {
      operator_delete(local_d8.super_TapBranch._vptr_TapBranch);
    }
    this_00 = (vector<cfd::core::TaprootScriptTree,_std::allocator<cfd::core::TaprootScriptTree>_> *
              )operator_new(0x18);
    std::vector<cfd::core::TaprootScriptTree,_std::allocator<cfd::core::TaprootScriptTree>_>::vector
              (this_00,1,(allocator_type *)&local_d8);
    *(vector<cfd::core::TaprootScriptTree,_std::allocator<cfd::core::TaprootScriptTree>_> **)
     ((long)pvVar5 + 0x10) = this_00;
    puVar6 = (undefined8 *)operator_new(0x18);
    *puVar6 = 0;
    puVar6[1] = 0;
    puVar6[2] = 0;
    *(undefined8 **)((long)pvVar5 + 0x18) = puVar6;
    bVar3 = cfd::core::TapBranch::HasTapLeaf(pTVar9);
    if (bVar3) {
      cfd::core::TaprootScriptTree::TaprootScriptTree(&local_d8,pTVar9);
      this = (TaprootScriptTree *)**(undefined8 **)((long)pvVar5 + 0x10);
      if ((TaprootScriptTree *)(*(undefined8 **)((long)pvVar5 + 0x10))[1] == this) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
      }
      cfd::core::TaprootScriptTree::operator=(this,&local_d8);
      local_d8.super_TapBranch._vptr_TapBranch = (_func_int **)&PTR__TaprootScriptTree_0072eb30;
      std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
                (&local_d8.nodes_);
      cfd::core::TapBranch::~TapBranch(&local_d8.super_TapBranch);
    }
    else {
      std::vector<cfd::core::TapBranch,std::allocator<cfd::core::TapBranch>>::
      emplace_back<cfd::core::TapBranch&>
                (*(vector<cfd::core::TapBranch,std::allocator<cfd::core::TapBranch>> **)
                  ((long)pvVar5 + 0x18),pTVar9);
    }
    *branch_tree_handle = pvVar5;
    if (branch_hash != (char **)0x0) {
      *branch_hash = pcVar4;
    }
    if (local_48.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_48.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    std::vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>::~vector(&local_f0);
    return 0;
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
}

Assistant:

int CfdGetTapBranchHandle(
    void* handle, void* tree_handle, uint8_t index_from_leaf,
    char** branch_hash, void** branch_tree_handle) {
  int result = CfdErrorCode::kCfdUnknownError;
  char* work_branch_hash = nullptr;
  CfdCapiTapscriptTree* work_branch_buffer = nullptr;
  try {
    cfd::Initialize();
    CheckBuffer(tree_handle, kPrefixTapscriptTree);
    if (branch_tree_handle == nullptr) {
      warn(CFD_LOG_SOURCE, "branch_tree_handle is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. branch_tree_handle is null or empty.");
    }
    CfdCapiTapscriptTree* buffer =
        static_cast<CfdCapiTapscriptTree*>(tree_handle);
    TapBranch* branch;
    if (!buffer->branch_buffer->empty()) {
      branch = &buffer->branch_buffer->at(0);
    } else {
      branch = &buffer->tree_buffer->at(0);
    }

    auto branches = branch->GetBranchList();
    uint32_t max = static_cast<uint32_t>(branches.size());
    if (max <= index_from_leaf) {
      warn(CFD_LOG_SOURCE, "index_from_leaf is out of range.");
      throw CfdException(
          CfdError::kCfdOutOfRangeError,
          "Failed to parameter. index_from_leaf is out of range.");
    }
    TapBranch& branch_data = branches.at(index_from_leaf);
    ByteData256 hash_obj = branch_data.GetCurrentBranchHash();
    if (branch_hash != nullptr) {
      work_branch_hash = CreateString(hash_obj.GetHex());
    }

    work_branch_buffer = static_cast<CfdCapiTapscriptTree*>(
        AllocBuffer(kPrefixTapscriptTree, sizeof(CfdCapiTapscriptTree)));
    work_branch_buffer->tree_buffer = new std::vector<TaprootScriptTree>(1);
    work_branch_buffer->branch_buffer = new std::vector<TapBranch>();
    if (branch_data.HasTapLeaf()) {
      TaprootScriptTree tree(branch_data);
      auto& dest_tree = work_branch_buffer->tree_buffer->at(0);
      dest_tree = tree;
    } else {
      work_branch_buffer->branch_buffer->emplace_back(branch_data);
    }

    *branch_tree_handle = work_branch_buffer;
    if (branch_hash != nullptr) *branch_hash = work_branch_hash;
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  FreeBufferOnError(&work_branch_hash);
  CfdFreeTaprootScriptTreeHandle(handle, work_branch_buffer);
  return result;
}